

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O0

int dosit(void)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  trap *ptVar8;
  permonst *ptr;
  obj *poVar9;
  bool bVar10;
  char *local_48;
  obj *uegg;
  int cnt;
  int attr_amount;
  int which_attr;
  obj *obj;
  int typ;
  trap *trap;
  
  cVar1 = level->locations[u.ux][u.uy].typ;
  if (u.usteed != (monst *)0x0) {
    pcVar7 = mon_nam(u.usteed);
    pline("You are already sitting on %s.",pcVar7);
    return 0;
  }
  bVar2 = can_reach_floor();
  if (bVar2 == '\0') {
    if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
       ((youmonst.data)->mlet != '\x05')) {
      pline("You are sitting on air.");
    }
    else {
      pline("You tumble in place.");
    }
    return 0;
  }
  bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
  if ((bVar2 == '\0') || (((byte)u._1052_1_ >> 1 & 1) != 0)) {
    ptVar8 = t_at(level,(int)u.ux,(int)u.uy);
    if ((((ptVar8 != (trap *)0x0) && (u.utrap == 0)) &&
        (((((ptVar8->field_0x8 & 0x1f) == 0xd || ((ptVar8->field_0x8 & 0x1f) == 0xe)) ||
          ((ptVar8->field_0x8 & 0x1f) == 0xb)) || ((ptVar8->field_0x8 & 0x1f) == 0xc)))) &&
       (((byte)ptVar8->field_0x8 >> 5 & 1) != 0)) {
      if ((ptVar8->field_0x8 & 0x1f) == 0xd) {
        local_48 = "hole";
      }
      else {
        local_48 = "pit";
        if ((ptVar8->field_0x8 & 0x1f) == 0xe) {
          local_48 = "trapdoor";
        }
      }
      pline("You sit on the edge of the %s.",local_48);
      return 1;
    }
    if (level->objects[u.ux][u.uy] != (obj *)0x0) {
      poVar9 = level->objects[u.ux][u.uy];
      pcVar7 = xname(poVar9);
      pcVar7 = the(pcVar7);
      pline("You sit on %s.",pcVar7);
      if (poVar9->otyp == 0xda) {
        return 1;
      }
      if (poVar9->otyp == 0xdb) {
        return 1;
      }
      if (poVar9->otyp == 0xdc) {
        return 1;
      }
      if ((*(ushort *)&objects[poVar9->otyp].field_0x11 >> 4 & 0x1f) == 6) {
        return 1;
      }
      pline("It\'s not very comfortable...");
      return 1;
    }
    ptVar8 = t_at(level,(int)u.ux,(int)u.uy);
    if ((ptVar8 != (trap *)0x0) || ((u.utrap != 0 && (2 < u.utraptype)))) {
      if (u.utrap == 0) {
        pline("You sit down.");
        dotrap(ptVar8,0);
        return 1;
      }
      exercise(2,'\0');
      if (u.utraptype == 0) {
        pcVar7 = body_part(5);
        pline("You can\'t sit down with your %s in the bear trap.",pcVar7);
        u.utrap = u.utrap + 1;
        return 1;
      }
      if (u.utraptype == 1) {
        if ((ptVar8->field_0x8 & 0x1f) == 0xc) {
          pline("You sit down on a spike.  Ouch!");
          losehp(1,"sitting on an iron spike",1);
          exercise(0,'\0');
        }
        else {
          pline("You sit down in the pit.");
        }
        iVar3 = rn2(5);
        u.utrap = iVar3 + u.utrap;
        return 1;
      }
      if (u.utraptype == 2) {
        pline("You sit in the spider web and get entangled further!");
        iVar3 = rn2(10);
        u.utrap = iVar3 + 5 + u.utrap;
        return 1;
      }
      if (u.utraptype == 3) {
        pline("You sit in the lava!");
        iVar3 = rnd(4);
        u.utrap = iVar3 + u.utrap;
        iVar3 = dice(2,10);
        losehp(iVar3,"sitting in lava",1);
        return 1;
      }
      if (u.utraptype != 4) {
        return 1;
      }
      pline("You can\'t maneuver to sit!");
      u.utrap = u.utrap + 1;
      return 1;
    }
    if ((((byte)u._1052_1_ >> 1 & 1) != 0) ||
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar2 != '\0') {
        pline("There are no cushions floating nearby.");
        return 1;
      }
      pline("You sit down on the muddy bottom.");
      return 1;
    }
    bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
    if (bVar2 == '\0') {
      if (cVar1 == '\x1f') {
        pline("You sit on the %s.","sink");
        pcVar7 = "underside";
        if (((youmonst.data)->mflags1 & 0x20000) != 0) {
          pcVar7 = "rump";
        }
        pline("Your %s gets wet.",pcVar7);
        return 1;
      }
      if (cVar1 == '!') {
        pline("You sit on the %s.","altar");
        altar_wrath((int)u.ux,(int)u.uy);
        return 1;
      }
      if (cVar1 == ' ') {
        pline("You sit on the %s.","grave");
        return 1;
      }
      if (cVar1 == '\x1a') {
        pline("You sit on the %s.","stairs");
        return 1;
      }
      if (cVar1 == '\x1b') {
        pline("You sit on the %s.","ladder");
        return 1;
      }
      bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
      if (bVar2 != '\0') {
        pline("You sit on the %s.","lava");
        burn_away_slime();
        if ((youmonst.data != mons + 0xa0) && (youmonst.data != mons + 0x157)) {
          pline("The lava burns you!");
          iVar3 = dice(10,10);
          fire_damageu(iVar3,(monst *)0x0,"sitting on lava",1,0x14,'\0','\x01');
          return 1;
        }
        pline("The lava feels warm.");
        return 1;
      }
      bVar2 = is_ice(level,(int)u.ux,(int)u.uy);
      if (bVar2 != '\0') {
        pline("You sit on the %s.","ice");
        if (((u.uprops[2].intrinsic != 0) || (u.uprops[2].extrinsic != 0)) ||
           ((youmonst.mintrinsics & 2) != 0)) {
          if ((u.uprops[2].intrinsic & 0x4000000) == 0) {
            return 1;
          }
          if ((u.uprops[2].intrinsic & 0xfbffffff) != 0) {
            return 1;
          }
          if (u.uprops[2].extrinsic != 0) {
            return 1;
          }
          if ((youmonst.mintrinsics & 2) != 0) {
            return 1;
          }
        }
        pline("The ice feels cold.");
        return 1;
      }
      if (cVar1 == '$') {
        pline("You sit on the %s.","drawbridge");
        return 1;
      }
      if (cVar1 == '\x1d') {
        pline("You sit on the %s.");
        iVar3 = rnd(6);
        if (iVar3 < 5) {
          if (((youmonst.data)->mflags2 & 0x1000) == 0) {
            pline("You feel somehow out of place...");
          }
          else {
            pline("You feel very comfortable here.");
          }
        }
        else {
          iVar3 = rn2(6);
          iVar4 = rn2(4);
          iVar5 = rnd(0xd);
          switch(iVar5) {
          case 1:
            adjattrib(iVar3,-3 - iVar4,'\0',0);
            iVar3 = rnd(10);
            losehp(iVar3,"cursed throne",0);
            break;
          case 2:
            iVar3 = rn2(6);
            adjattrib(iVar3,1,'\0',0);
            break;
          case 3:
            bVar10 = true;
            if ((u.uprops[5].intrinsic == 0) && (bVar10 = true, u.uprops[5].extrinsic == 0)) {
              bVar10 = (youmonst.mintrinsics & 0x10) != 0;
            }
            pcVar7 = " massive";
            if (bVar10) {
              pcVar7 = "n";
            }
            pline("A%s electric shock shoots through your body!",pcVar7);
            iVar3 = rnd(0x1e);
            elec_damageu(iVar3,(monst *)0x0,"electric chair",0,0,'\0');
            break;
          case 4:
            pline("You feel much, much better!");
            if (u.umonnum != u.umonster) {
              if (u.mhmax + -5 <= u.mh) {
                u.mhmax = u.mhmax + 4;
              }
              u.mh = u.mhmax;
            }
            if (u.uhpmax + -5 <= u.uhp) {
              u.uhpmax = u.uhpmax + 4;
            }
            u.uhp = u.uhpmax;
            make_blinded(0,'\x01');
            make_sick(0,(char *)0x0,'\0',3);
            heal_legs();
            iflags.botl = '\x01';
            break;
          case 5:
            take_gold();
            break;
          case 6:
            iVar3 = (int)u.uluck;
            iVar4 = rn2(5);
            if (iVar3 + iVar4 < 0) {
              pline("You feel your luck is changing.");
              change_luck('\x01');
            }
            else {
              fix_attributes_and_properties((obj *)0x0,6);
            }
            break;
          case 7:
            uegg._4_4_ = rnd(10);
            pline("A voice echoes:");
            pcVar7 = "Sire";
            if (flags.female != '\0') {
              pcVar7 = "Dame";
            }
            verbalize("Thy audience hath been summoned, %s!",pcVar7);
            while (uegg._4_4_ != 0) {
              ptr = courtmon(&u.uz);
              makemon(ptr,level,(int)u.ux,(int)u.uy,0);
              uegg._4_4_ = uegg._4_4_ + -1;
            }
            break;
          case 8:
            pline("A voice echoes:");
            verbalize("By thy Imperious order, %s...");
            do_genocide(5,'\0');
            break;
          case 9:
            pline("A voice echoes:");
            verbalize("A curse upon thee for sitting upon this most holy throne!");
            uVar6 = u.uprops[0x1e].intrinsic;
            if ((int)u.uluck + (int)u.moreluck < 1) {
              rndcurse();
            }
            else {
              iVar3 = rn2(100);
              make_blinded((ulong)(uVar6 + iVar3 + 0xfa),'\x01');
            }
            break;
          case 10:
            if (((int)u.uluck + (int)u.moreluck < 0) || ((u.uprops[0xc].intrinsic & 0x7000000) != 0)
               ) {
              if ((*(uint *)&(level->flags).field_0x8 >> 0xd & 1) == 0) {
                pline("An image forms in your mind.");
                do_mapping();
              }
              else {
                pline("A terrible drone fills your head!");
                uVar6 = u.uprops[0x1c].intrinsic;
                iVar3 = rnd(0x1e);
                make_confused((ulong)(uVar6 + iVar3),'\0');
              }
            }
            else {
              pline("Your vision becomes clear.");
              u.uprops[0xc].intrinsic = u.uprops[0xc].intrinsic | 0x4000000;
              newsym((int)u.ux,(int)u.uy);
            }
            break;
          case 0xb:
            if ((int)u.uluck + (int)u.moreluck < 0) {
              pline("You feel threatened.");
              aggravate();
            }
            else {
              pline("You feel a wrenching sensation.");
              tele((char *)0x0);
            }
            break;
          case 0xc:
            pline("You are granted an insight!");
            if (invent != (obj *)0x0) {
              iVar3 = rn2(4);
              identify_pack(iVar3 + 3);
            }
            break;
          case 0xd:
            pline("Your mind turns into a pretzel!");
            uVar6 = u.uprops[0x1c].intrinsic;
            iVar3 = rn2(7);
            make_confused((ulong)(uVar6 + iVar3 + 0x10),'\0');
            break;
          default:
            impossible("throne effect");
          }
        }
        iVar3 = rn2(3);
        if (iVar3 != 0) {
          return 1;
        }
        if (level->locations[u.ux][u.uy].typ != '\x1d') {
          return 1;
        }
        level->locations[u.ux][u.uy].typ = '\x19';
        pline("The throne vanishes in a puff of logic.");
        newsym((int)u.ux,(int)u.uy);
        return 1;
      }
      if (((youmonst.data)->mflags1 & 0x400000) == 0) {
        if ((u._1052_1_ & 1) != 0) {
          pline("There are no seats in here!");
          return 1;
        }
        pcVar7 = surface((int)u.ux,(int)u.uy);
        pline("Having fun sitting on the %s?",pcVar7);
        return 1;
      }
      if (flags.female != '\0') {
        if ((int)(uint)objects[0x10f].oc_nutrition <= u.uhunger) {
          poVar9 = mksobj(level,0x10f,'\0','\0');
          poVar9->spe = '\x01';
          poVar9->quan = 1;
          uVar6 = weight(poVar9);
          poVar9->owt = uVar6;
          iVar3 = egg_type_from_parent(u.umonnum,'\0');
          poVar9->corpsenm = iVar3;
          *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a & 0xffffffdf | 0x20;
          *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a & 0xffffffef | 0x10;
          attach_egg_hatch_timeout(poVar9);
          pline("You lay an egg.");
          dropy(poVar9);
          stackobj(poVar9);
          morehungry((uint)objects[0x10f].oc_nutrition);
          return 1;
        }
        pline("You don\'t have enough energy to lay an egg.");
        return 0;
      }
      pline("Males can\'t lay eggs!");
      return 0;
    }
  }
  pline("You sit in the water.");
  iVar3 = rn2(10);
  if ((iVar3 == 0) && (uarm != (obj *)0x0)) {
    rust_dmg(uarm,"armor",1,'\x01',&youmonst);
  }
  iVar3 = rn2(10);
  if (((iVar3 == 0) && (uarmf != (obj *)0x0)) && (uarmf->otyp != 0x97)) {
    rust_dmg(uarm,"armor",1,'\x01',&youmonst);
  }
  return 1;
}

Assistant:

int dosit(void)
{
	static const char sit_message[] = "You sit on the %s.";
	struct trap *trap;
	int typ = level->locations[u.ux][u.uy].typ;


	if (u.usteed) {
	    pline("You are already sitting on %s.", mon_nam(u.usteed));
	    return 0;
	}

	if (!can_reach_floor())	{
	    if (Levitation)
		pline("You tumble in place.");
	    else
		pline("You are sitting on air.");
	    return 0;
	} else if (is_pool(level, u.ux, u.uy) && !Underwater) {  /* water walking */
	    goto in_water;
	}

	if ((trap = t_at(level, u.ux, u.uy)) != 0 && !u.utrap &&
	    (trap->ttyp == HOLE || trap->ttyp == TRAPDOOR ||
	     trap->ttyp == PIT || trap->ttyp == SPIKED_PIT) &&
	     trap->tseen) {
	    pline("You sit on the edge of the %s.",
		  trap->ttyp == HOLE ? "hole" :
		  trap->ttyp == TRAPDOOR ? "trapdoor" : "pit");
	    return 1;
	}

	if (OBJ_AT(u.ux, u.uy)) {
	    struct obj *obj;

	    obj = level->objects[u.ux][u.uy];
	    pline("You sit on %s.", the(xname(obj)));
	    if (!(Is_box(obj) || objects[obj->otyp].oc_material == CLOTH))
		pline("It's not very comfortable...");

	} else if ((trap = t_at(level, u.ux, u.uy)) != 0 ||
		   (u.utrap && (u.utraptype >= TT_LAVA))) {

	    if (u.utrap) {
		exercise(A_WIS, FALSE);	/* you're getting stuck longer */
		if (u.utraptype == TT_BEARTRAP) {
		    pline("You can't sit down with your %s in the bear trap.", body_part(FOOT));
		    u.utrap++;
	        } else if (u.utraptype == TT_PIT) {
		    if (trap->ttyp == SPIKED_PIT) {
			pline("You sit down on a spike.  Ouch!");
			losehp(1, "sitting on an iron spike", KILLED_BY);
			exercise(A_STR, FALSE);
		    } else
			pline("You sit down in the pit.");
		    u.utrap += rn2(5);
		} else if (u.utraptype == TT_WEB) {
		    pline("You sit in the spider web and get entangled further!");
		    u.utrap += rn1(10, 5);
		} else if (u.utraptype == TT_LAVA) {
		    /* Must have fire resistance or they'd be dead already */
		    pline("You sit in the lava!");
		    u.utrap += rnd(4);
		    losehp(dice(2,10), "sitting in lava", KILLED_BY);
		} else if (u.utraptype == TT_INFLOOR) {
		    pline("You can't maneuver to sit!");
		    u.utrap++;
		}
	    } else {
	        pline("You sit down.");
		dotrap(trap, 0);
	    }
	} else if (Underwater || Is_waterlevel(&u.uz)) {
	    if (Is_waterlevel(&u.uz))
		pline("There are no cushions floating nearby.");
	    else
		pline("You sit down on the muddy bottom.");
	} else if (is_pool(level, u.ux, u.uy)) {
 in_water:
	    pline("You sit in the water.");
	    if (!rn2(10) && uarm)
		rust_dmg(uarm, "armor", 1, TRUE, &youmonst);
	    if (!rn2(10) && uarmf && uarmf->otyp != WATER_WALKING_BOOTS)
		rust_dmg(uarm, "armor", 1, TRUE, &youmonst);
	} else if (IS_SINK(typ)) {

	    pline(sit_message, defexplain[S_sink]);
	    pline("Your %s gets wet.", humanoid(youmonst.data) ? "rump" : "underside");
	} else if (IS_ALTAR(typ)) {

	    pline(sit_message, defexplain[S_altar]);
	    altar_wrath(u.ux, u.uy);

	} else if (IS_GRAVE(typ)) {

	    pline(sit_message, defexplain[S_grave]);

	} else if (typ == STAIRS) {

	    pline(sit_message, "stairs");

	} else if (typ == LADDER) {

	    pline(sit_message, "ladder");

	} else if (is_lava(level, u.ux, u.uy)) {

	    /* must be WWalking */
	    pline(sit_message, "lava");
	    burn_away_slime();
	    if (likes_lava(youmonst.data)) {
		pline("The lava feels warm.");
		return 1;
	    }
	    pline("The lava burns you!");
	    fire_damageu(dice(10, 10), NULL, "sitting on lava", KILLED_BY,
			 20, FALSE, TRUE);

	} else if (is_ice(level, u.ux, u.uy)) {

	    pline(sit_message, defexplain[S_ice]);
	    if (!FCold_resistance) pline("The ice feels cold.");

	} else if (typ == DRAWBRIDGE_DOWN) {

	    pline(sit_message, "drawbridge");

	} else if (IS_THRONE(typ)) {

	    pline(sit_message, defexplain[S_throne]);
	    if (rnd(6) > 4)  {
		int which_attr = rn2(A_MAX);
		int attr_amount = -rn1(4,3);
		switch (rnd(13))  {
		    case 1:
			adjattrib(which_attr, attr_amount, FALSE, 0);
			losehp(rnd(10), "cursed throne", KILLED_BY_AN);
			break;
		    case 2:
			adjattrib(rn2(A_MAX), 1, FALSE, 0);
			break;
		    case 3:
			pline("A%s electric shock shoots through your body!",
			      (Shock_resistance) ? "n" : " massive");
			elec_damageu(rnd(30), NULL, "electric chair", KILLED_BY_AN,
				     0, FALSE);
			break;
		    case 4:
			pline("You feel much, much better!");
			if (Upolyd) {
			    if (u.mh >= (u.mhmax - 5))  u.mhmax += 4;
			    u.mh = u.mhmax;
			}
			if (u.uhp >= (u.uhpmax - 5))  u.uhpmax += 4;
			u.uhp = u.uhpmax;
			make_blinded(0L,TRUE);
			make_sick(0L, NULL, FALSE, SICK_ALL);
			heal_legs();
			iflags.botl = 1;
			break;
		    case 5:
			take_gold();
			break;
		    case 6:
			if (u.uluck + rn2(5) < 0) {
			    pline("You feel your luck is changing.");
			    change_luck(1);
			} else {
			    fix_attributes_and_properties(NULL, 6);
			}
			break;
		    case 7:
			{
			int cnt = rnd(10);

			pline("A voice echoes:");
			verbalize("Thy audience hath been summoned, %s!",
				  flags.female ? "Dame" : "Sire");
			while (cnt--)
			    makemon(courtmon(&u.uz), level, u.ux, u.uy, NO_MM_FLAGS);
			break;
			}
		    case 8:
			pline("A voice echoes:");
			verbalize("By thy Imperious order, %s...",
				  flags.female ? "Dame" : "Sire");
			do_genocide(5, FALSE);	/* REALLY|ONTHRONE, see do_genocide() */
			break;
		    case 9:
			pline("A voice echoes:");
	verbalize("A curse upon thee for sitting upon this most holy throne!");
			if (Luck > 0)  {
			    make_blinded(Blinded + rn1(100,250),TRUE);
			} else	    rndcurse();
			break;
		    case 10:
			if (Luck < 0 || (HSee_invisible & INTRINSIC))  {
				if (level->flags.nommap) {
					pline(
					"A terrible drone fills your head!");
					make_confused(HConfusion + rnd(30),
									FALSE);
				} else {
					pline("An image forms in your mind.");
					do_mapping();
				}
			} else  {
				pline("Your vision becomes clear.");
				HSee_invisible |= FROMOUTSIDE;
				newsym(u.ux, u.uy);
			}
			break;
		    case 11:
			if (Luck < 0)  {
			    pline("You feel threatened.");
			    aggravate();
			} else  {

			    pline("You feel a wrenching sensation.");
			    tele(NULL);		/* teleport him */
			}
			break;
		    case 12:
			pline("You are granted an insight!");
			if (invent) {
			    /* rn1(4, 3) agrees w/seffects() */
			    identify_pack(rn1(4, 3));
			}
			break;
		    case 13:
			pline("Your mind turns into a pretzel!");
			make_confused(HConfusion + rn1(7,16),FALSE);
			break;
		    default:	impossible("throne effect");
				break;
		}
	    } else {
		if (is_prince(youmonst.data))
		    pline("You feel very comfortable here.");
		else
		    pline("You feel somehow out of place...");
	    }

	    if (!rn2(3) && IS_THRONE(level->locations[u.ux][u.uy].typ)) {
		/* may have teleported */
		level->locations[u.ux][u.uy].typ = ROOM;
		pline("The throne vanishes in a puff of logic.");
		newsym(u.ux,u.uy);
	    }

	} else if (lays_eggs(youmonst.data)) {
		struct obj *uegg;

		if (!flags.female) {
			pline("Males can't lay eggs!");
			return 0;
		}

		if (u.uhunger < (int)objects[EGG].oc_nutrition) {
			pline("You don't have enough energy to lay an egg.");
			return 0;
		}

		uegg = mksobj(level, EGG, FALSE, FALSE);
		uegg->spe = 1;
		uegg->quan = 1;
		uegg->owt = weight(uegg);
		uegg->corpsenm = egg_type_from_parent(u.umonnum, FALSE);
		uegg->known = uegg->dknown = 1;
		attach_egg_hatch_timeout(uegg);
		pline("You lay an egg.");
		dropy(uegg);
		stackobj(uegg);
		morehungry((int)objects[EGG].oc_nutrition);
	} else if (u.uswallow)
		pline("There are no seats in here!");
	else
		pline("Having fun sitting on the %s?", surface(u.ux,u.uy));
	return 1;
}